

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

SchemeObject * OpenOutputPortProcedure(SchemeObject *arguments)

{
  int iVar1;
  SchemeObject *pSVar2;
  FILE *pFVar3;
  SchemeObject **ppSVar4;
  
  pSVar2 = Car(arguments);
  pSVar2 = (pSVar2->data).pair.car;
  pFVar3 = fopen((char *)pSVar2,"w");
  if (pFVar3 != (FILE *)0x0) {
    pSVar2 = AllocObject();
    pSVar2->type = OUT_PORT;
    (pSVar2->data).pair.car = (SchemeObject *)pFVar3;
    return pSVar2;
  }
  OpenOutputPortProcedure_cold_1();
  pSVar2 = Car(pSVar2);
  pFVar3 = (FILE *)(pSVar2->data).pair.car;
  iVar1 = fclose(pFVar3);
  if (iVar1 != -1) {
    return OkSymbol;
  }
  CloseOutputPortProcedure_cold_1();
  pSVar2 = Car((SchemeObject *)pFVar3);
  if (pSVar2->type == OUT_PORT) {
    ppSVar4 = &True;
  }
  else {
    ppSVar4 = &False;
  }
  return *ppSVar4;
}

Assistant:

extern SchemeObject*
OpenOutputPortProcedure(SchemeObject* arguments)
{
    char* filename = Car(arguments)->data.string.value;
    FILE* out = fopen(filename, "w");

    if (out == NULL) {
        fprintf(stderr, "could not open file: \"%s\".\n", filename);
        exit(1);
    }
    return MakeOutputPort(out);
}